

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall ftxui::BgColor::BgColor(BgColor *this,Element *child,Color color)

{
  shared_ptr<ftxui::Node> local_30;
  Element *local_20;
  Element *child_local;
  BgColor *this_local;
  Color color_local;
  
  local_20 = child;
  child_local = (Element *)this;
  this_local._4_4_ = color;
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_30,child);
  NodeDecorator::NodeDecorator(&this->super_NodeDecorator,&local_30);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_30);
  (this->super_NodeDecorator).super_Node._vptr_Node = (_func_int **)&PTR__BgColor_0021a120;
  (this->super_NodeDecorator).super_Node.field_0x5c = this_local._4_1_;
  (this->super_NodeDecorator).super_Node.field_0x5d = this_local._5_1_;
  (this->super_NodeDecorator).super_Node.field_0x5e = this_local._6_1_;
  (this->super_NodeDecorator).super_Node.field_0x5f = this_local._7_1_;
  return;
}

Assistant:

BgColor(Element child, Color color)
      : NodeDecorator(std::move(child)), color_(color) {}